

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

void Dau_DsdInitialize(Dau_Dsd_t *p,int nVarsInit)

{
  int local_20;
  int local_1c;
  int u;
  int v;
  int i;
  int nVarsInit_local;
  Dau_Dsd_t *p_local;
  
  if ((-1 < nVarsInit) && (nVarsInit < 0x11)) {
    p->nVarsInit = nVarsInit;
    p->nVarsUsed = nVarsInit;
    p->nPos = 0;
    p->nSizeNonDec = 0;
    p->nConsts = 0;
    p->uConstMask = 0;
    for (u = 0; u < nVarsInit; u = u + 1) {
      p->pVarDefs[u][0] = (char)u + 'a';
      p->pVarDefs[u][1] = '\0';
    }
    for (local_1c = 0; local_1c < nVarsInit; local_1c = local_1c + 1) {
      for (local_20 = 0; local_20 < nVarsInit; local_20 = local_20 + 1) {
        p->Cache[local_1c][local_20] = '\0';
      }
    }
    return;
  }
  __assert_fail("nVarsInit >= 0 && nVarsInit <= 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                ,0x3dc,"void Dau_DsdInitialize(Dau_Dsd_t *, int)");
}

Assistant:

static inline void Dau_DsdInitialize( Dau_Dsd_t * p, int nVarsInit )
{
    int i, v, u;
    assert( nVarsInit >= 0 && nVarsInit <= 16 );
    p->nVarsInit   = nVarsInit;
    p->nVarsUsed   = nVarsInit;
    p->nPos        = 0;
    p->nSizeNonDec = 0;
    p->nConsts     = 0;
    p->uConstMask  = 0;
    for ( i = 0; i < nVarsInit; i++ )
        p->pVarDefs[i][0] = 'a' + i, p->pVarDefs[i][1] = 0;
    for ( v = 0; v < nVarsInit; v++ )
    for ( u = 0; u < nVarsInit; u++ )
        p->Cache[v][u] = 0;

}